

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O2

void __thiscall HTTPReplySender::~HTTPReplySender(HTTPReplySender *this)

{
  OS_Counter *pOVar1;
  vm_httpreq_cookie *this_00;
  http_header *this_01;
  TadsMessageQueue *pTVar2;
  TadsHttpRequest *pTVar3;
  bodyArg *this_02;
  
  (this->super_CVmRefCntObj)._vptr_CVmRefCntObj = (_func_int **)&PTR__HTTPReplySender_00343bc0;
  if (this->async != 0) {
    lib_free_str(this->status);
    lib_free_str(this->cont_type);
    this_00 = this->cookies;
    if (this_00 != (vm_httpreq_cookie *)0x0) {
      vm_httpreq_cookie::~vm_httpreq_cookie(this_00);
      operator_delete(this_00,0x18);
    }
  }
  this_01 = this->headers;
  if (this_01 != (http_header *)0x0) {
    http_header::~http_header(this_01);
    operator_delete(this_01,0x18);
  }
  pTVar2 = this->queue;
  if (pTVar2 != (TadsMessageQueue *)0x0) {
    LOCK();
    pOVar1 = &(pTVar2->super_CVmRefCntObj).cnt;
    (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1
    ;
    UNLOCK();
    if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
      (*(pTVar2->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])();
    }
  }
  pTVar3 = this->req;
  if (pTVar3 != (TadsHttpRequest *)0x0) {
    LOCK();
    pOVar1 = &(pTVar3->super_TadsEventMessage).super_TadsMessage.super_CVmRefCntObj.cnt;
    (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1
    ;
    UNLOCK();
    if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
      (*(pTVar3->super_TadsEventMessage).super_TadsMessage.super_CVmRefCntObj._vptr_CVmRefCntObj[1])
                ();
    }
  }
  if (this->reqvar != (vm_globalvar_t *)0x0) {
    CVmObjTable::delete_global_var(&G_obj_table_X,this->reqvar);
  }
  this_02 = this->body;
  if (this_02 != (bodyArg *)0x0) {
    bodyArg::~bodyArg(this_02);
    operator_delete(this_02,0x58);
    return;
  }
  return;
}

Assistant:

~HTTPReplySender()
    {
        /* if we're in async mode, delete our private parameter data */
        if (async)
        {
            lib_free_str((char *)status);
            lib_free_str((char *)cont_type);
            if (cookies != 0)
                delete cookies;
        }

        /* delete the headers (we always copy these) */
        if (headers != 0)
            delete headers;

        /* release the net event queue */
        if (queue != 0)
            queue->release_ref();

        /* done with the request object and VM global */
        if (req != 0)
            req->release_ref();
        if (reqvar != 0)
        {
            VMGLOB_PTR(vmg);
            G_obj_table->delete_global_var(reqvar);
        }

        /* done with the body object */
        if (body != 0)
            delete body;
    }